

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  anon_struct_60_5_be74bf41_for_shading *n;
  ulong uVar2;
  float a;
  undefined1 auVar3 [16];
  Vector3f wiRender;
  Vector3f wiRender_00;
  Tuple3<pbrt::Vector3,_float> woRender;
  Interaction *pIVar4;
  bool bVar5;
  int iVar6;
  SampledLight *pSVar7;
  long in_FS_OFFSET;
  Float FVar8;
  type a_00;
  Point2f PVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  SampledSpectrum SVar22;
  Float f_1;
  DispatchSplit<9> local_1c9;
  Vector3f wi;
  Float g;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  undefined1 local_188 [16];
  SampledSpectrum *pSStack_178;
  undefined4 *puStack_170;
  Interval<float> local_168;
  Interval<float> IStack_160;
  Interval<float> IStack_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  optional<pbrt::SampledLight> sampledLight;
  undefined4 local_114;
  undefined8 local_110;
  LightLiSample ls;
  SampledSpectrum f;
  SampledSpectrum local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar15 [56];
  undefined1 auVar21 [56];
  
  ls.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  ls.L.values.values._0_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  ls.L.values.values._8_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  ls.wi.super_Tuple3<pbrt::Vector3,_float>.z =
       (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  ls.pdf = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  ls.light.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits._0_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  ls._36_8_ = *(undefined8 *)&(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>;
  ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
       (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  FVar8 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
          ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                      *)sampler);
  LightSamplerHandle::Sample(&sampledLight,&this->lightSampler,(LightSampleContext *)&ls,FVar8);
  PVar9 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
          ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                      *)sampler);
  uStack_1b0 = extraout_XMM0_Qb;
  g = PVar9.super_Tuple2<pbrt::Point2,_float>.x;
  uStack_1b4 = PVar9.super_Tuple2<pbrt::Point2,_float>.y;
  SVar22.values.values = (array<float,_4>)ZEXT816(0);
  if (sampledLight.set == false) goto LAB_003ebcd7;
  pSVar7 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
  IStack_158 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  uVar2 = (pSVar7->light).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  n = &intr->shading;
  local_168 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  IStack_160 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  pIVar4 = &intr->super_Interaction;
  f.values.values[0] =
       (pIVar4->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  f.values.values[1] =
       (pIVar4->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  f.values.values[2] =
       (pIVar4->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  f.values.values[3] =
       (pIVar4->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uStack_150._0_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uStack_150._4_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_148 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_144._0_4_ = (n->n).super_Tuple3<pbrt::Normal3,_float>.x;
  local_144._4_4_ = (n->n).super_Tuple3<pbrt::Normal3,_float>.y;
  local_13c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  pSStack_178 = &local_58;
  local_58.values.values = *(array<float,_4> *)(lambda->lambda).values;
  uStack_48 = *(undefined8 *)(lambda->pdf).values;
  uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
  puStack_170 = &local_114;
  local_114 = 0;
  local_188._8_8_ = &local_110;
  local_188._0_8_ = &f;
  local_110 = vmovlps_avx(_g);
  wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar2;
  detail::DispatchSplit<9>::operator()
            (&ls,&local_1c9,&wi,uVar2 >> 0x30,local_13c,&f,&f,&local_110,pSStack_178,puStack_170);
  if (0.0 < ls.pdf) {
    bVar5 = SampledSpectrum::operator_cast_to_bool(&ls.L);
    SVar22.values.values = (array<float,_4>)ZEXT816(0);
    if (!bVar5) goto LAB_003ebcd7;
    pVVar1 = &(intr->super_Interaction).wo;
    woRender = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
    wi.super_Tuple3<pbrt::Vector3,_float>.x = ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    wi.super_Tuple3<pbrt::Vector3,_float>.y = ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    wi.super_Tuple3<pbrt::Vector3,_float>.z = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.x = ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.y = ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar21 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
    auVar15 = ZEXT856(0);
    SVar22 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,Radiance);
    auVar16._0_8_ = SVar22.values.values._8_8_;
    auVar16._8_56_ = auVar21;
    auVar10._0_8_ = SVar22.values.values._0_8_;
    auVar10._8_56_ = auVar15;
    local_188 = vmovlhps_avx(auVar10._0_16_,auVar16._0_16_);
    a_00 = AbsDot<float>(&wi,&n->n);
    auVar15 = extraout_var;
    SVar22 = SampledSpectrum::operator*((SampledSpectrum *)local_188,a_00);
    auVar17._0_8_ = SVar22.values.values._8_8_;
    auVar17._8_56_ = auVar21;
    auVar11._0_8_ = SVar22.values.values._0_8_;
    auVar11._8_56_ = auVar15;
    f.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar17._0_16_);
    bVar5 = SampledSpectrum::operator_cast_to_bool(&f);
    if (bVar5) {
      bVar5 = Integrator::Unoccluded((Integrator *)this,&intr->super_Interaction,&ls.pLight);
      auVar15 = ZEXT856(0);
      SVar22.values.values = (array<float,_4>)ZEXT816(0);
      if (bVar5) {
        pSVar7 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
        a = pSVar7->pdf * ls.pdf;
        auVar21 = (undefined1  [56])0x0;
        if (*(uint *)(uVar2 & 0xffffffffffff) < 2) {
          SVar22 = SampledSpectrum::operator*(&f,&ls.L);
          auVar18._0_8_ = SVar22.values.values._8_8_;
          auVar18._8_56_ = auVar15;
          auVar12._0_8_ = SVar22.values.values._0_8_;
          auVar12._8_56_ = auVar21;
          local_188 = vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
          SVar22 = SampledSpectrum::operator/((SampledSpectrum *)local_188,a);
        }
        else {
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z
          ;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x
          ;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y
          ;
          FVar8 = BSDF::PDF(bsdf,(Vector3f)woRender,wiRender_00,Radiance,All);
          if (SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
              ::reg == '\0') {
            iVar6 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                         ::reg);
            if (iVar6 != 0) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                          ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                ::StatsAccumulator__,(PixelAccumFunc)0x0);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                   ::reg);
            }
          }
          auVar21 = (undefined1  [56])0x0;
          *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
          auVar15 = ZEXT856(0);
          if (((FVar8 == 0.0) && (!NAN(FVar8))) &&
             (1 < *(ushort *)
                   ((long)&(bsdf->bxdf).
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits + 6) - 3)) {
            *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
          }
          SVar22 = SampledSpectrum::operator*(&f,&ls.L);
          auVar19._0_8_ = SVar22.values.values._8_8_;
          auVar19._8_56_ = auVar21;
          auVar13._0_8_ = SVar22.values.values._0_8_;
          auVar13._8_56_ = auVar15;
          local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(FVar8 * FVar8)),ZEXT416((uint)a),ZEXT416((uint)a))
          ;
          auVar15 = ZEXT856(0);
          SVar22 = SampledSpectrum::operator*(&local_58,(a * a) / auVar3._0_4_);
          auVar20._0_8_ = SVar22.values.values._8_8_;
          auVar20._8_56_ = auVar21;
          auVar14._0_8_ = SVar22.values.values._0_8_;
          auVar14._8_56_ = auVar15;
          local_188 = vmovlhps_avx(auVar14._0_16_,auVar20._0_16_);
          SVar22 = SampledSpectrum::operator/((SampledSpectrum *)local_188,a);
        }
      }
      goto LAB_003ebcd7;
    }
  }
  SVar22.values.values = (array<float,_4>)(ZEXT816(0) << 0x40);
LAB_003ebcd7:
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  return (array<float,_4>)(array<float,_4>)SVar22;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);

    // Sample a point on the light source for direct lighting
    LightLiSample ls = light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls.wi;
    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls.pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls.pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls.L / lightPDF;
    else {
        Float bsdfPDF = bsdf.PDF(wo, wi);
        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false && bsdfPDF == 0);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls.L * weight / lightPDF;
    }
}